

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdStarter.c
# Opt level: O1

void Cmd_RunStarter(char *pFileName,char *pBinary,char *pCommand,int nCores)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  size_t sVar5;
  byte *__s;
  void *__ptr;
  char *pcVar6;
  long lVar7;
  FILE *__stream_00;
  char *pcVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  timespec ts;
  timespec local_70;
  char *local_60;
  long local_58;
  size_t local_50;
  FILE *local_48;
  ulong local_40;
  char *local_38;
  
  iVar2 = clock_gettime(3,&local_70);
  if (iVar2 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  if (nCores < 2) {
    fprintf(_stdout,"The number of cores (%d) should be more than 1.\n",(ulong)(uint)nCores);
    return;
  }
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Input file \"%s\" cannot be opened.\n",pFileName);
    return;
  }
  iVar10 = 0;
  iVar2 = 0;
  local_60 = pFileName;
  local_58 = lVar9;
  do {
    iVar12 = 0;
    do {
      iVar3 = fgetc(__stream);
      if (iVar3 == -1) {
        iVar3 = 0;
        iVar12 = 0;
        if (pBinary != (char *)0x0) {
          sVar5 = strlen(pBinary);
          iVar12 = (int)sVar5;
        }
        if (pCommand != (char *)0x0) {
          sVar5 = strlen(pCommand);
          iVar3 = (int)sVar5;
        }
        iVar3 = iVar2 * 2 + 100 + iVar12 + iVar3;
        local_50 = (size_t)iVar3;
        __s = (byte *)malloc(local_50);
        local_40 = (ulong)(iVar10 + 10);
        __ptr = malloc(local_40 * 8);
        if (pCommand == (char *)0x0) goto LAB_0087bd72;
        rewind(__stream);
        pcVar6 = fgets((char *)__s,iVar3,__stream);
        goto joined_r0x0087bcdf;
      }
      iVar12 = iVar12 + 1;
    } while (iVar3 != 10);
    iVar10 = iVar10 + 1;
    if (iVar2 <= iVar12) {
      iVar2 = iVar12;
    }
  } while( true );
joined_r0x0087bcdf:
  if (pcVar6 == (char *)0x0) {
LAB_0087bd72:
    rewind(__stream);
    pcVar6 = fgets((char *)__s,iVar3,__stream);
    if (pcVar6 != (char *)0x0) {
      uVar11 = 0;
      local_48 = __stream;
      do {
        sVar5 = strlen((char *)__s);
        uVar4 = (int)sVar5 - 1;
        if (-1 < (int)uVar4) {
          lVar9 = (ulong)uVar4 + 1;
          do {
            if ((0x20 < (ulong)__s[lVar9 + -1]) ||
               ((0x100002600U >> ((ulong)__s[lVar9 + -1] & 0x3f) & 1) == 0)) break;
            __s[lVar9 + -1] = 0;
            lVar7 = lVar9 + -1;
            bVar1 = 0 < lVar9;
            lVar9 = lVar7;
          } while (lVar7 != 0 && bVar1);
        }
        if ((0x23 < (ulong)*__s) || ((0x900002601U >> ((ulong)*__s & 0x3f) & 1) == 0)) {
          if (pCommand == (char *)0x0) {
            sVar5 = strlen((char *)__s);
            pcVar6 = (char *)malloc(sVar5 + 1);
            strcpy(pcVar6,(char *)__s);
          }
          else {
            pcVar6 = (char *)malloc(local_50);
            pcVar8 = Extra_FileNameGenericAppend((char *)__s,".txt");
            sprintf(pcVar6,"%s -c \"%s; %s\" > %s",pBinary,__s,pCommand,pcVar8);
          }
          local_38 = pcVar6;
          fprintf(_stdout,"Calling:  %s\n",pcVar6);
          fflush(_stdout);
          do {
            iVar10 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
            iVar2 = nThreadsRunning;
            if (iVar10 != 0) {
              __assert_fail("status == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                            ,0xd5,"void Cmd_RunStarter(char *, char *, char *, int)");
            }
            iVar10 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
            if (iVar10 != 0) {
              __assert_fail("status == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                            ,0xd7,"void Cmd_RunStarter(char *, char *, char *, int)");
            }
          } while (nCores + -1 <= iVar2);
          iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
          if (iVar2 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xde,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
          nThreadsRunning = nThreadsRunning + 1;
          iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          __stream = local_48;
          if (iVar2 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xe0,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
          iVar2 = pthread_create((pthread_t *)((long)__ptr + uVar11 * 8),(pthread_attr_t *)0x0,
                                 Abc_RunThread,local_38);
          if (iVar2 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xe3,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
          if (local_40 <= uVar11) {
            __assert_fail("i < nLines",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xe4,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
        }
        uVar11 = uVar11 + 1;
        pcVar6 = fgets((char *)__s,iVar3,__stream);
      } while (pcVar6 != (char *)0x0);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    if (__s != (byte *)0x0) {
      free(__s);
    }
    fclose(__stream);
    while( true ) {
      iVar10 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
      iVar2 = nThreadsRunning;
      if (iVar10 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                      ,0xed,"void Cmd_RunStarter(char *, char *, char *, int)");
      }
      iVar10 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      if (iVar10 != 0) break;
      if (iVar2 == 0) {
        fprintf(_stdout,"Finished processing commands in file \"%s\".  ",local_60);
        iVar10 = 3;
        iVar2 = clock_gettime(3,&local_70);
        if (iVar2 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        lVar9 = lVar9 + local_58;
        Abc_Print(iVar10,"%s =","Total wall time");
        Abc_Print(iVar10,"%9.2f sec\n",(double)lVar9 / 1000000.0);
        fflush(_stdout);
        return;
      }
    }
    __assert_fail("status == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                  ,0xef,"void Cmd_RunStarter(char *, char *, char *, int)");
  }
  sVar5 = strlen((char *)__s);
  uVar4 = (int)sVar5 - 1;
  if (-1 < (int)uVar4) {
    lVar9 = (ulong)uVar4 + 1;
    do {
      if ((0x20 < (ulong)__s[lVar9 + -1]) ||
         ((0x100002600U >> ((ulong)__s[lVar9 + -1] & 0x3f) & 1) == 0)) break;
      __s[lVar9 + -1] = 0;
      lVar7 = lVar9 + -1;
      bVar1 = 0 < lVar9;
      lVar9 = lVar7;
    } while (lVar7 != 0 && bVar1);
  }
  if ((0x23 < (ulong)*__s) || ((0x900002601U >> ((ulong)*__s & 0x3f) & 1) == 0)) {
    __stream_00 = fopen((char *)__s,"rb");
    if (__stream_00 == (FILE *)0x0) {
      fprintf(_stdout,"Starter cannot open file \"%s\".\n",__s);
      fflush(_stdout);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      free(__s);
      fclose(__stream);
      return;
    }
    fclose(__stream_00);
  }
  pcVar6 = fgets((char *)__s,iVar3,__stream);
  goto joined_r0x0087bcdf;
}

Assistant:

void Cmd_RunStarter( char * pFileName, char * pBinary, char * pCommand, int nCores )
{
    FILE * pFile, * pFileTemp;
    pthread_t * pThreadIds;
    char * BufferCopy, * Buffer;
    int nLines, LineMax, Line, Len;
    int i, c, status, Counter;
    abctime clk = Abc_Clock();

    // check the number of cores
    if ( nCores < 2 )
    {
        fprintf( stdout, "The number of cores (%d) should be more than 1.\n", nCores ); 
        return; 
    }

    // open the file and make sure it is available
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    { 
        fprintf( stdout, "Input file \"%s\" cannot be opened.\n", pFileName ); 
        return; 
    }

    // count the number of lines and the longest line
    nLines = LineMax = Line = 0;
    while ( (c = fgetc(pFile)) != EOF )
    {
        Line++;
        if ( c != '\n' )
            continue;
        nLines++;
        LineMax = Abc_MaxInt( LineMax, Line );
        Line = 0;       
    }
    nLines += 10;
    LineMax += LineMax + 100;
    LineMax += pBinary  ? strlen(pBinary) : 0;
    LineMax += pCommand ? strlen(pCommand) : 0;

    // allocate storage
    Buffer = ABC_ALLOC( char, LineMax );
    pThreadIds = ABC_ALLOC( pthread_t, nLines );

    // check if all files can be opened
    if ( pCommand != NULL )
    {
        // read file names
        rewind( pFile );
        for ( i = 0; fgets( Buffer, LineMax, pFile ) != NULL; i++ )
        {
            // remove trailing spaces
            for ( Len = strlen(Buffer) - 1; Len >= 0; Len-- )
                if ( Buffer[Len] == '\n' || Buffer[Len] == '\r' || Buffer[Len] == '\t' || Buffer[Len] == ' ' )
                    Buffer[Len] = 0;
                else
                    break;

            // get command from file
            if ( Buffer[0] == 0 || Buffer[0] == '\n' || Buffer[0] == '\r' || Buffer[0] == '\t' || Buffer[0] == ' ' || Buffer[0] == '#' )
                continue;

            // try to open the file
            pFileTemp = fopen( Buffer, "rb" );
            if ( pFileTemp == NULL )
            {
                fprintf( stdout, "Starter cannot open file \"%s\".\n", Buffer );
                fflush( stdout );
                ABC_FREE( pThreadIds );
                ABC_FREE( Buffer );
                fclose( pFile );
                return;
            }
            fclose( pFileTemp );
        }
    } 
 
    // read commands and execute at most <num> of them at a time
    rewind( pFile );
    for ( i = 0; fgets( Buffer, LineMax, pFile ) != NULL; i++ )
    {
        // remove trailing spaces
        for ( Len = strlen(Buffer) - 1; Len >= 0; Len-- )
            if ( Buffer[Len] == '\n' || Buffer[Len] == '\r' || Buffer[Len] == '\t' || Buffer[Len] == ' ' )
                Buffer[Len] = 0;
            else
                break;

        // get command from file
        if ( Buffer[0] == 0 || Buffer[0] == '\n' || Buffer[0] == '\r' || Buffer[0] == '\t' || Buffer[0] == ' ' || Buffer[0] == '#' )
            continue;

        // create command
        if ( pCommand != NULL )
        {
            BufferCopy = ABC_ALLOC( char, LineMax );
            sprintf( BufferCopy, "%s -c \"%s; %s\" > %s", pBinary, Buffer, pCommand, Extra_FileNameGenericAppend(Buffer, ".txt") );
        }
        else
            BufferCopy = Abc_UtilStrsav( Buffer );
        fprintf( stdout, "Calling:  %s\n", (char *)BufferCopy );  
        fflush( stdout );

        // wait till there is an empty thread
        while ( 1 )
        {
            status = pthread_mutex_lock(&mutex);   assert(status == 0);
            Counter = nThreadsRunning;
            status = pthread_mutex_unlock(&mutex); assert(status == 0);
            if ( Counter < nCores - 1 )
                break;
//            Sleep( 100 );
        }

        // increament the number of threads running
        status = pthread_mutex_lock(&mutex);   assert(status == 0);
        nThreadsRunning++;
        status = pthread_mutex_unlock(&mutex); assert(status == 0);

        // create thread to execute this command
        status = pthread_create( &pThreadIds[i], NULL, Abc_RunThread, (void *)BufferCopy );  assert(status == 0);
        assert( i < nLines );
    }
    ABC_FREE( pThreadIds );
    ABC_FREE( Buffer );
    fclose( pFile );

    // wait for all the threads to finish
    while ( 1 )
    {
        status = pthread_mutex_lock(&mutex);   assert(status == 0);
        Counter = nThreadsRunning;
        status = pthread_mutex_unlock(&mutex); assert(status == 0);
        if ( Counter == 0 )
            break;
    }

    // cleanup
//    status = pthread_mutex_destroy(&mutex);   assert(status == 0);
//    mutex = PTHREAD_MUTEX_INITIALIZER;
    fprintf( stdout, "Finished processing commands in file \"%s\".  ", pFileName );
    Abc_PrintTime( 1, "Total wall time", Abc_Clock() - clk );
    fflush( stdout );
}